

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.cpp
# Opt level: O1

void __thiscall ElectricityBill::AddNewRoom(ElectricityBill *this,RoomInfo *room_info)

{
  size_type *psVar1;
  pointer pcVar2;
  FileForAppend *this_00;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  std::vector<RoomInfo,_std::allocator<RoomInfo>_>::push_back(&this->room_informations_,room_info);
  psVar1 = &__str._M_string_length;
  pcVar2 = (room_info->flatname)._M_dataplus._M_p;
  local_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + (room_info->flatname)._M_string_length);
  std::__cxx11::string::append((char *)local_48);
  this_00 = &this->room_file_;
  higan::FileForAppend::Append(this_00,(string *)local_48);
  if (local_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_48,__str._M_string_length + 1);
  }
  pcVar2 = (room_info->roomname)._M_dataplus._M_p;
  local_48 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + (room_info->roomname)._M_string_length);
  std::__cxx11::string::append((char *)local_48);
  higan::FileForAppend::Append(this_00,(string *)local_48);
  if (local_48 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_48,__str._M_string_length + 1);
  }
  higan::FileForAppend::Flush(this_00);
  return;
}

Assistant:

void ElectricityBill::AddNewRoom(const RoomInfo& room_info)
{
	room_informations_.push_back(room_info);

	room_file_.Append(room_info.flatname + "\n");
	room_file_.Append(room_info.roomname + "\n");
	room_file_.Flush();
}